

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::plot
          (Persistence_landscape *this,char *filename,double xRangeBegin,double xRangeEnd,
          double yRangeBegin,double yRangeEnd,int from,int to)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pvVar6;
  long lVar7;
  pointer pvVar8;
  int iVar9;
  ulong uVar10;
  size_t i;
  ulong uVar11;
  long lVar12;
  char *local_3c8 [4];
  ofstream out;
  ostringstream gnuplot_script;
  
  std::ofstream::ofstream(&out);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gnuplot_script);
  poVar2 = std::operator<<((ostream *)&gnuplot_script,filename);
  std::operator<<(poVar2,"_GnuplotScript");
  std::__cxx11::stringbuf::str();
  std::ofstream::open((char *)&out,(_Ios_Openmode)local_3c8[0]);
  std::__cxx11::string::~string((string *)local_3c8);
  if (((((xRangeBegin != 1.79769313486232e+308) || (NAN(xRangeBegin))) ||
       (xRangeEnd != 1.79769313486232e+308)) ||
      ((NAN(xRangeEnd) || (yRangeBegin != 1.79769313486232e+308)))) ||
     ((NAN(yRangeBegin) || ((yRangeEnd != 1.79769313486232e+308 || (NAN(yRangeEnd))))))) {
    std::operator<<((ostream *)&out,"set xrange [");
    poVar2 = std::ostream::_M_insert<double>(xRangeBegin);
    std::operator<<(poVar2," : ");
    poVar2 = std::ostream::_M_insert<double>(xRangeEnd);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&out,"set yrange [");
    poVar2 = std::ostream::_M_insert<double>(yRangeBegin);
    std::operator<<(poVar2," : ");
    poVar2 = std::ostream::_M_insert<double>(yRangeEnd);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  iVar9 = 0;
  if (from != 0x7fffffff) {
    iVar9 = from;
  }
  if (to == 0x7fffffff) {
    to = (int)(((long)(this->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->land).
                     super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  }
  std::operator<<((ostream *)&out,"plot ");
  uVar10 = (ulong)iVar9;
  uVar3 = ((long)(this->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->land).
                super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar10 <= uVar3) {
    uVar3 = uVar10;
  }
  uVar11 = (ulong)to;
  while( true ) {
    pvVar8 = (this->land).
             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (this->land).
             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = ((long)pvVar6 - (long)pvVar8) / 0x18;
    uVar5 = uVar11;
    if (uVar4 < uVar11) {
      uVar5 = uVar4;
    }
    if (uVar3 == uVar5) break;
    std::operator<<((ostream *)&out,"     \'-\' using 1:2 notitle with lp");
    uVar3 = uVar3 + 1;
    uVar5 = ((long)(this->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar11 <= uVar5) {
      uVar5 = uVar11;
    }
    if (uVar3 != uVar5) {
      std::operator<<((ostream *)&out,", \\");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&out);
  }
  if (uVar4 < uVar10) {
    uVar10 = uVar4;
  }
  while( true ) {
    uVar3 = ((long)pvVar6 - (long)pvVar8) / 0x18;
    if (uVar11 <= uVar3) {
      uVar3 = uVar11;
    }
    if (uVar10 == uVar3) break;
    lVar7 = 0;
    for (lVar12 = 1;
        lVar1 = *(long *)&pvVar8[uVar10].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl,
        lVar12 != ((long)*(pointer *)
                          ((long)&pvVar8[uVar10].
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl + 8) - lVar1 >> 4) + -1; lVar12 = lVar12 + 1) {
      poVar2 = std::ostream::_M_insert<double>(*(double *)(lVar1 + 0x10 + lVar7));
      std::operator<<(poVar2," ");
      poVar2 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)&(this->land).
                                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                      ._M_impl + 0x18 + lVar7));
      std::endl<char,std::char_traits<char>>(poVar2);
      pvVar8 = (this->land).
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    }
    poVar2 = std::operator<<((ostream *)&out,"EOF");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar10 = uVar10 + 1;
    pvVar8 = (this->land).
             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (this->land).
             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
                          );
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(poVar2,local_3c8[0]);
  poVar2 = std::operator<<(poVar2,"\'\"");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gnuplot_script);
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void Persistence_landscape::plot(const char* filename, double xRangeBegin, double xRangeEnd, double yRangeBegin,
                                 double yRangeEnd, int from, int to) {
  // this program create a gnuplot script file that allows to plot persistence diagram.
  std::ofstream out;

  std::ostringstream gnuplot_script;
  gnuplot_script << filename << "_GnuplotScript";
  out.open(gnuplot_script.str().c_str());

  if ((xRangeBegin != std::numeric_limits<double>::max()) || (xRangeEnd != std::numeric_limits<double>::max()) ||
      (yRangeBegin != std::numeric_limits<double>::max()) || (yRangeEnd != std::numeric_limits<double>::max())) {
    out << "set xrange [" << xRangeBegin << " : " << xRangeEnd << "]" << std::endl;
    out << "set yrange [" << yRangeBegin << " : " << yRangeEnd << "]" << std::endl;
  }

  if (from == std::numeric_limits<int>::max()) {
    from = 0;
  }
  if (to == std::numeric_limits<int>::max()) {
    to = this->land.size();
  }

  out << "plot ";
  for (size_t lambda = std::min((size_t)from, this->land.size()); lambda != std::min((size_t)to, this->land.size());
       ++lambda) {
    // out << "     '-' using 1:2 title 'l" << lambda << "' with lp";
    out << "     '-' using 1:2 notitle with lp";
    if (lambda + 1 != std::min((size_t)to, this->land.size())) {
      out << ", \\";
    }
    out << std::endl;
  }

  for (size_t lambda = std::min((size_t)from, this->land.size()); lambda != std::min((size_t)to, this->land.size());
       ++lambda) {
    for (size_t i = 1; i != this->land[lambda].size() - 1; ++i) {
      out << this->land[lambda][i].first << " " << this->land[lambda][i].second << std::endl;
    }
    out << "EOF" << std::endl;
  }
  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
}